

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O1

void __thiscall stk::StkError::StkError(StkError *this,string *message,Type type)

{
  pointer pcVar1;
  
  this->_vptr_StkError = (_func_int **)&PTR__StkError_00116c60;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + message->_M_string_length);
  this->type_ = type;
  return;
}

Assistant:

StkError(const std::string& message, Type type = StkError::UNSPECIFIED)
    : message_(message), type_(type) {}